

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

X509_EXTENSION * do_ext_i2d(X509V3_EXT_METHOD *method,int ext_nid,int crit,void *ext_struc)

{
  int len;
  ASN1_OCTET_STRING *str;
  X509V3_EXT_METHOD *pXVar1;
  X509_EXTENSION *ext;
  ASN1_OCTET_STRING *ext_oct;
  uchar *puStack_30;
  int ext_len;
  uchar *ext_der;
  void *ext_struc_local;
  int crit_local;
  int ext_nid_local;
  X509V3_EXT_METHOD *method_local;
  
  puStack_30 = (uchar *)0x0;
  ext_der = (uchar *)ext_struc;
  ext_struc_local._0_4_ = crit;
  ext_struc_local._4_4_ = ext_nid;
  _crit_local = method;
  len = ASN1_item_i2d((ASN1_VALUE *)ext_struc,&stack0xffffffffffffffd0,(ASN1_ITEM *)method->it);
  if (len < 0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    str = ASN1_OCTET_STRING_new();
    if (str == (ASN1_OCTET_STRING *)0x0) {
      OPENSSL_free(puStack_30);
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
    else {
      ASN1_STRING_set0(str,puStack_30,len);
      pXVar1 = (X509V3_EXT_METHOD *)
               X509_EXTENSION_create_by_NID
                         ((X509_EXTENSION **)0x0,ext_struc_local._4_4_,(int)ext_struc_local,str);
      ASN1_OCTET_STRING_free(str);
      method_local = pXVar1;
    }
  }
  return (X509_EXTENSION *)method_local;
}

Assistant:

static X509_EXTENSION *do_ext_i2d(const X509V3_EXT_METHOD *method, int ext_nid,
                                  int crit, void *ext_struc) {
  // Convert the extension's internal representation to DER.
  unsigned char *ext_der = NULL;
  int ext_len = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(ext_struc),
                              &ext_der, ASN1_ITEM_ptr(method->it));
  if (ext_len < 0) {
    return NULL;
  }

  ASN1_OCTET_STRING *ext_oct = ASN1_OCTET_STRING_new();
  if (ext_oct == NULL) {
    OPENSSL_free(ext_der);
    return NULL;
  }
  ASN1_STRING_set0(ext_oct, ext_der, ext_len);

  X509_EXTENSION *ext =
      X509_EXTENSION_create_by_NID(NULL, ext_nid, crit, ext_oct);
  ASN1_OCTET_STRING_free(ext_oct);
  return ext;
}